

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O1

int wc_match_fragment(char **fragment,char **target,char *target_end)

{
  byte *pbVar1;
  byte bVar2;
  int in_EAX;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  
  pbVar5 = (byte *)*fragment;
  pbVar3 = (byte *)*target;
  while( true ) {
    bVar2 = *pbVar5;
    if ((bVar2 == 0) || (bVar2 == 0x2a)) goto LAB_00120b7e;
    if (target_end <= pbVar3) break;
    if (bVar2 == 0x3f) {
LAB_00120b39:
      pbVar5 = pbVar5 + 1;
    }
    else if (bVar2 == 0x5b) {
      pbVar6 = pbVar5 + 1;
      pbVar1 = pbVar5 + 1;
      pbVar5 = pbVar5 + 2;
      if (*pbVar1 != 0x5e) {
        pbVar5 = pbVar6;
      }
      bVar7 = false;
      do {
        while( true ) {
          if (*pbVar5 == 0x5c) {
            pbVar5 = pbVar5 + 1;
          }
          else if (*pbVar5 == 0x5d) {
            bVar8 = false;
            if ((*pbVar1 == 0x5e) == bVar7) {
              in_EAX = 0;
            }
            else {
              pbVar5 = pbVar5 + 1;
              bVar8 = true;
            }
            goto LAB_00120b66;
          }
          bVar2 = *pbVar5;
          if (bVar2 == 0) {
            in_EAX = -2;
            bVar8 = false;
            goto LAB_00120b66;
          }
          if (pbVar5[1] == 0x2d) break;
          pbVar5 = pbVar5 + 1;
          bVar7 = (bool)(bVar7 | *pbVar3 == bVar2);
        }
        pbVar6 = pbVar5 + 2;
        if (pbVar5[2] == 0x5d) {
          bVar8 = false;
          in_EAX = -3;
          pbVar5 = pbVar6;
        }
        else {
          if (pbVar5[2] == 0x5c) {
            pbVar6 = pbVar5 + 3;
          }
          bVar4 = *pbVar6;
          if (bVar4 == 0) {
            in_EAX = -2;
            bVar8 = false;
            pbVar5 = pbVar6;
          }
          else {
            bVar9 = bVar4;
            if (bVar2 >= bVar4 && bVar2 != bVar4) {
              bVar9 = bVar2;
            }
            if (bVar2 < bVar4) {
              bVar4 = bVar2;
            }
            bVar8 = true;
            if (bVar9 < *pbVar3) {
              bVar8 = bVar7;
            }
            if (*pbVar3 < bVar4) {
              bVar8 = bVar7;
            }
            bVar7 = bVar8;
            bVar8 = true;
            pbVar5 = pbVar6 + 1;
          }
        }
      } while (bVar8);
      bVar8 = false;
LAB_00120b66:
      if (!bVar8) {
        return in_EAX;
      }
    }
    else {
      if (bVar2 != 0x5c) {
        if (bVar2 != *pbVar3) {
          return 0;
        }
        goto LAB_00120b39;
      }
      if (pbVar5[1] == 0) {
        return -1;
      }
      if (pbVar5[1] != *pbVar3) {
        return 0;
      }
      pbVar5 = pbVar5 + 2;
    }
    pbVar3 = pbVar3 + 1;
  }
  if ((bVar2 != 0x2a) && (bVar2 != 0)) {
    return 0;
  }
LAB_00120b7e:
  *fragment = (char *)pbVar5;
  *target = (char *)pbVar3;
  return 1;
}

Assistant:

static int wc_match_fragment(const char **fragment, const char **target,
                             const char *target_end)
{
    const char *f, *t;

    f = *fragment;
    t = *target;
    /*
     * The fragment terminates at either the end of the string, or
     * the first (unescaped) *.
     */
    while (*f && *f != '*' && t < target_end) {
        /*
         * Extract one character from t, and one character's worth
         * of pattern from f, and step along both. Return 0 if they
         * fail to match.
         */
        if (*f == '\\') {
            /*
             * Backslash, which means f[1] is to be treated as a
             * literal character no matter what it is. It may not
             * be the end of the string.
             */
            if (!f[1])
                return -WC_TRAILINGBACKSLASH;   /* error */
            if (f[1] != *t)
                return 0;              /* failed to match */
            f += 2;
        } else if (*f == '?') {
            /*
             * Question mark matches anything.
             */
            f++;
        } else if (*f == '[') {
            bool invert = false;
            bool matched = false;
            /*
             * Open bracket introduces a character class.
             */
            f++;
            if (*f == '^') {
                invert = true;
                f++;
            }
            while (*f != ']') {
                if (*f == '\\')
                    f++;               /* backslashes still work */
                if (!*f)
                    return -WC_UNCLOSEDCLASS;   /* error again */
                if (f[1] == '-') {
                    int lower, upper, ourchr;
                    lower = (unsigned char) *f++;
                    f++;               /* eat the minus */
                    if (*f == ']')
                        return -WC_INVALIDRANGE;   /* different error! */
                    if (*f == '\\')
                        f++;           /* backslashes _still_ work */
                    if (!*f)
                        return -WC_UNCLOSEDCLASS;   /* error again */
                    upper = (unsigned char) *f++;
                    ourchr = (unsigned char) *t;
                    if (lower > upper) {
                        int t = lower; lower = upper; upper = t;
                    }
                    if (ourchr >= lower && ourchr <= upper)
                        matched = true;
                } else {
                    matched |= (*t == *f++);
                }
            }
            if (invert == matched)
                return 0;              /* failed to match character class */
            f++;                       /* eat the ] */
        } else {
            /*
             * Non-special character matches itself.
             */
            if (*f != *t)
                return 0;
            f++;
        }
        /*
         * Now we've done that, increment t past the character we
         * matched.
         */
        t++;
    }
    if (!*f || *f == '*') {
        /*
         * We have reached the end of f without finding a mismatch;
         * so we're done. Update the caller pointers and return 1.
         */
        *fragment = f;
        *target = t;
        return 1;
    }
    /*
     * Otherwise, we must have reached the end of t before we
     * reached the end of f; so we've failed. Return 0.
     */
    return 0;
}